

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::SetConfigurable(TypedArrayBase *this,PropertyId propertyId,BOOL value)

{
  ScriptContext *scriptContext_00;
  BOOL BVar1;
  ThreadContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  uint32 local_2c;
  ScriptContext *pSStack_28;
  uint32 index;
  ScriptContext *scriptContext;
  BOOL value_local;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  scriptContext._0_4_ = value;
  scriptContext._4_4_ = propertyId;
  _value_local = this;
  pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_28,scriptContext._4_4_,&local_2c);
  scriptContext_00 = pSStack_28;
  if (BVar1 == 0) {
    this_local._4_4_ =
         DynamicObject::SetConfigurable
                   ((DynamicObject *)this,scriptContext._4_4_,(BOOL)scriptContext);
  }
  else {
    if ((BOOL)scriptContext != 0) {
      this_00 = ScriptContext::GetThreadContext(pSStack_28);
      this_01 = ThreadContext::GetPropertyName(this_00,scriptContext._4_4_);
      varName = PropertyRecord::GetBuffer(this_01);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec2a,varName);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL TypedArrayBase::SetConfigurable(PropertyId propertyId, BOOL value)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;

        // default is not configurable
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (value)
            {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable,
                scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
            }
            return true;
        }

        return __super::SetConfigurable(propertyId, value);
    }